

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

string * __thiscall
tinyusdz::usda::USDAReader::get_error_abi_cxx11_(string *__return_storage_ptr__,USDAReader *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_impl->_err);
  return __return_storage_ptr__;
}

Assistant:

std::string USDAReader::get_error() { return _impl->GetError(); }